

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::FeatureVectorizer::ByteSizeLong(FeatureVectorizer *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  uint index;
  size_t sVar5;
  
  uVar1 = (this->inputlist_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = (size_t)uVar1;
  if (sVar5 == 0) {
    sVar5 = 0;
  }
  else {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                          (&(this->inputlist_).super_RepeatedPtrFieldBase,index);
      sVar4 = FeatureVectorizer_InputColumn::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t FeatureVectorizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureVectorizer)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FeatureVectorizer.InputColumn inputList = 1;
  {
    unsigned int count = this->inputlist_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->inputlist(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}